

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

SequenceCatalogEntry *
duckdb::BindSequence(Binder *binder,string *catalog,string *schema,string *name)

{
  EntryLookupInfo sequence_lookup;
  optional_ptr<duckdb::CatalogEntry,_true> local_50;
  EntryLookupInfo local_48;
  
  Binder::BindSchemaOrCatalog(binder->context,catalog,schema);
  EntryLookupInfo::EntryLookupInfo
            (&local_48,SEQUENCE_ENTRY,name,(QueryErrorContext)0xffffffffffffffff);
  local_50 = CatalogEntryRetriever::GetEntry
                       (&binder->entry_retriever,catalog,schema,&local_48,THROW_EXCEPTION);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_50);
  return (SequenceCatalogEntry *)local_50.ptr;
}

Assistant:

SequenceCatalogEntry &BindSequence(Binder &binder, string &catalog, string &schema, const string &name) {
	// fetch the sequence from the catalog
	Binder::BindSchemaOrCatalog(binder.context, catalog, schema);
	EntryLookupInfo sequence_lookup(CatalogType::SEQUENCE_ENTRY, name);
	return binder.EntryRetriever().GetEntry(catalog, schema, sequence_lookup)->Cast<SequenceCatalogEntry>();
}